

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.h
# Opt level: O3

bool __thiscall Clasp::PBBuilder::doStartProgram(PBBuilder *this)

{
  this->auxVar_ = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.size;
  this->soft_ = 0x7fffffffffffffff;
  (this->assume_).ebo_.size = 0;
  return true;
}

Assistant:

SharedContext*   ctx()    const { return ctx_; }